

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

_Bool ssh2_transport_timer_update(ssh2_transport_state *s,unsigned_long rekey_time)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long gssmins;
  unsigned_long now;
  unsigned_long next;
  unsigned_long ticks;
  unsigned_long mins;
  unsigned_long rekey_time_local;
  ssh2_transport_state *s_local;
  
  iVar1 = conf_get_int(s->conf,0x1b);
  ticks = sanitise_rekey_time(iVar1,0x3c);
  next._0_4_ = (int)ticks * 60000;
  if ((rekey_time != 0) && (rekey_time != ticks)) {
    uVar2 = getticks();
    if (rekey_time * 60000 < uVar2 - s->last_rekey) {
      return true;
    }
    next._0_4_ = ((int)s->last_rekey + (int)(rekey_time * 60000)) - (int)uVar2;
    ticks = rekey_time;
  }
  if ((s->gss_kex_used & 1U) != 0) {
    iVar1 = conf_get_int(s->conf,0x2d);
    uVar2 = sanitise_rekey_time(iVar1,2);
    if (uVar2 != 0) {
      if (uVar2 < ticks) {
        next._0_4_ = (int)uVar2 * 60000;
        ticks = uVar2;
      }
      if ((((s->gss_status & 1U) != 0) && ((s->gss_status & 4U) == 0)) &&
         (s->gss_ctxt_lifetime + ticks * -0x3c < 10)) {
        next._0_4_ = (int)next + -10000;
      }
    }
  }
  uVar2 = schedule_timer((int)next,ssh2_transport_timer,s);
  s->next_rekey = uVar2;
  return false;
}

Assistant:

static bool ssh2_transport_timer_update(struct ssh2_transport_state *s,
                                        unsigned long rekey_time)
{
    unsigned long mins;
    unsigned long ticks;

    mins = sanitise_rekey_time(conf_get_int(s->conf, CONF_ssh_rekey_time), 60);
    ticks = mins * 60 * TICKSPERSEC;

    /* Handle change from previous setting */
    if (rekey_time != 0 && rekey_time != mins) {
        unsigned long next;
        unsigned long now = GETTICKCOUNT();

        mins = rekey_time;
        ticks = mins * 60 * TICKSPERSEC;
        next = s->last_rekey + ticks;

        /* If overdue, caller will rekey synchronously now */
        if (now - s->last_rekey > ticks)
            return true;
        ticks = next - now;
    }

#ifndef NO_GSSAPI
    if (s->gss_kex_used) {
        /*
         * If we've used GSSAPI key exchange, then we should
         * periodically check whether we need to do another one to
         * pass new credentials to the server.
         */
        unsigned long gssmins;

        /* Check cascade conditions more frequently if configured */
        gssmins = sanitise_rekey_time(
            conf_get_int(s->conf, CONF_gssapirekey), GSS_DEF_REKEY_MINS);
        if (gssmins > 0) {
            if (gssmins < mins)
                ticks = (mins = gssmins) * 60 * TICKSPERSEC;

            if ((s->gss_status & GSS_KEX_CAPABLE) != 0) {
                /*
                 * Run next timer even sooner if it would otherwise be
                 * too close to the context expiration time
                 */
                if ((s->gss_status & GSS_CTXT_EXPIRES) == 0 &&
                    s->gss_ctxt_lifetime - mins * 60 < 2 * MIN_CTXT_LIFETIME)
                    ticks -= 2 * MIN_CTXT_LIFETIME * TICKSPERSEC;
            }
        }
    }
#endif

    /* Schedule the next timer */
    s->next_rekey = schedule_timer(ticks, ssh2_transport_timer, s);
    return false;
}